

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

tm * __thiscall fmt::v5::gmtime(v5 *this,time_t *__timer)

{
  bool bVar1;
  format_error *this_00;
  dispatcher gt;
  char *in_stack_ffffffffffffff88;
  dispatcher *in_stack_ffffffffffffff90;
  dispatcher local_48;
  time_t *local_8;
  
  local_8 = __timer;
  gmtime::dispatcher::dispatcher(&local_48,(time_t)__timer);
  bVar1 = gmtime::dispatcher::run(in_stack_ffffffffffffff90);
  if (!bVar1) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  memcpy(this,&local_48.tm_,0x38);
  return (tm *)this;
}

Assistant:

inline std::tm gmtime(std::time_t time) {
  struct dispatcher {
    std::time_t time_;
    std::tm tm_;

    dispatcher(std::time_t t): time_(t) {}

    bool run() {
      using namespace fmt::internal;
      return handle(gmtime_r(&time_, &tm_));
    }

    bool handle(std::tm *tm) { return tm != FMT_NULL; }

    bool handle(internal::null<>) {
      using namespace fmt::internal;
      return fallback(gmtime_s(&tm_, &time_));
    }

    bool fallback(int res) { return res == 0; }

#if !FMT_MSC_VER
    bool fallback(internal::null<>) {
      std::tm *tm = std::gmtime(&time_);
      if (tm) tm_ = *tm;
      return tm != FMT_NULL;
    }
#endif
  };
  dispatcher gt(time);
  // Too big time values may be unsupported.
  if (!gt.run())
    FMT_THROW(format_error("time_t value out of range"));
  return gt.tm_;
}